

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O2

Extra_FileReader_t *
Extra_FileReaderAlloc(char *pFileName,char *pCharsComment,char *pCharsStop,char *pCharsClean)

{
  int iVar1;
  FILE *__stream;
  Extra_FileReader_t *pEVar2;
  long lVar3;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  char *pcVar9;
  int iVar10;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pEVar2 = (Extra_FileReader_t *)0x0;
    printf("Extra_FileReaderAlloc(): Cannot open input file \"%s\".\n",pFileName);
  }
  else {
    pEVar2 = (Extra_FileReader_t *)calloc(1,0x158);
    pEVar2->pFileName = pFileName;
    pEVar2->pFile = (FILE *)__stream;
    pcVar4 = pEVar2->pCharMap;
    memset(pcVar4,1,0x100);
    for (; (ulong)(byte)*pCharsComment != 0; pCharsComment = (char *)((byte *)pCharsComment + 1)) {
      pcVar4[(byte)*pCharsComment] = '\0';
    }
    for (; (ulong)(byte)*pCharsStop != 0; pCharsStop = (char *)((byte *)pCharsStop + 1)) {
      pcVar4[(byte)*pCharsStop] = '\x02';
    }
    for (; (ulong)(byte)*pCharsClean != 0; pCharsClean = (char *)((byte *)pCharsClean + 1)) {
      pcVar4[(byte)*pCharsClean] = '\x03';
    }
    fseek(__stream,0,2);
    lVar3 = ftell(__stream);
    iVar10 = (int)lVar3;
    pEVar2->nFileSize = iVar10;
    rewind(__stream);
    pcVar4 = (char *)malloc(0x400001);
    pEVar2->pBuffer = pcVar4;
    pEVar2->nBufferSize = 0x400000;
    pEVar2->pBufferCur = pcVar4;
    iVar1 = 0x400000;
    if (iVar10 < 0x400000) {
      iVar1 = iVar10;
    }
    fread(pcVar4,(long)iVar1,1,__stream);
    pEVar2->nFileRead = iVar1;
    pEVar2->pBufferEnd = pcVar4 + iVar1;
    pcVar9 = pcVar4 + 0x3ff000;
    if (iVar10 < 0x400001) {
      pcVar9 = pcVar4 + iVar1;
    }
    pEVar2->pBufferStop = pcVar9;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    pVVar5->pArray = ppvVar6;
    pEVar2->vTokens = pVVar5;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    pEVar2->vLines = pVVar7;
    pEVar2->nLineCounter = 1;
  }
  return pEVar2;
}

Assistant:

Extra_FileReader_t * Extra_FileReaderAlloc( char * pFileName, 
    char * pCharsComment, char * pCharsStop, char * pCharsClean )
{
    Extra_FileReader_t * p;
    FILE * pFile;
    char * pChar;
    int nCharsToRead;
    int RetValue;
    // check if the file can be opened
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Extra_FileReaderAlloc(): Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    // start the file reader    
    p = ABC_ALLOC( Extra_FileReader_t, 1 );
    memset( p, 0, sizeof(Extra_FileReader_t) );
    p->pFileName   = pFileName;
    p->pFile       = pFile;
    // set the character map
    memset( p->pCharMap, EXTRA_CHAR_NORMAL, 256 );
    for ( pChar = pCharsComment; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_COMMENT;
    for ( pChar = pCharsStop; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_STOP;
    for ( pChar = pCharsClean; *pChar; pChar++ )
        p->pCharMap[(unsigned char)*pChar] = EXTRA_CHAR_CLEAN;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    p->nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // allocate the buffer
    p->pBuffer = ABC_ALLOC( char, EXTRA_BUFFER_SIZE+1 );
    p->nBufferSize = EXTRA_BUFFER_SIZE;
    p->pBufferCur  = p->pBuffer;
    // determine how many chars to read
    nCharsToRead = EXTRA_MINIMUM(p->nFileSize, EXTRA_BUFFER_SIZE);
    // load the first part into the buffer
    RetValue = fread( p->pBuffer, nCharsToRead, 1, p->pFile );
    p->nFileRead = nCharsToRead;
    // set the ponters to the end and the stopping point
    p->pBufferEnd  = p->pBuffer + nCharsToRead;
    p->pBufferStop = (p->nFileRead == p->nFileSize)? p->pBufferEnd : p->pBuffer + EXTRA_BUFFER_SIZE - EXTRA_OFFSET_SIZE;
    // start the arrays
    p->vTokens = Vec_PtrAlloc( 100 );
    p->vLines = Vec_IntAlloc( 100 );
    p->nLineCounter = 1; // 1-based line counting
    return p;
}